

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddBlindTxInData(void *handle,void *blind_handle,char *txid,uint32_t vout,char *asset_string,
                       char *asset_blind_factor,char *value_blind_factor,int64_t value_satoshi,
                       char *asset_key,char *token_key)

{
  bool bVar1;
  CfdException *pCVar2;
  Amount AVar3;
  allocator local_179;
  undefined1 local_178 [32];
  ConfidentialAssetId local_158;
  TxInBlindParameters params;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&params,"BlindTxData",(allocator *)&local_158);
  cfd::capi::CheckBuffer(blind_handle,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  if (*(long *)((long)blind_handle + 0x10) == 0) {
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x49c;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddBlindTxInData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"buffer state is illegal.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. buffer state is illegal.",
               (allocator *)&local_158);
    cfd::core::CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)&params);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(asset_string);
    if (!bVar1) {
      cfd::api::TxInBlindParameters::TxInBlindParameters(&params);
      std::__cxx11::string::string((string *)local_178,txid,&local_179);
      cfd::core::Txid::Txid((Txid *)&local_158,(string *)local_178);
      cfd::core::Txid::operator=(&params.txid,(Txid *)&local_158);
      cfd::core::Txid::~Txid((Txid *)&local_158);
      std::__cxx11::string::~string((string *)local_178);
      params.vout = vout;
      std::__cxx11::string::string((string *)local_178,asset_string,&local_179);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_158,(string *)local_178);
      cfd::core::ConfidentialAssetId::operator=(&params.blind_param.asset,&local_158);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_158);
      std::__cxx11::string::~string((string *)local_178);
      AVar3 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
      local_178._0_8_ = AVar3.amount_;
      local_178[8] = AVar3.ignore_check_;
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&local_158,(Amount *)local_178);
      cfd::core::ConfidentialValue::operator=
                (&params.blind_param.value,(ConfidentialValue *)&local_158);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_158);
      bVar1 = cfd::capi::IsEmptyString(asset_blind_factor);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)local_178,
                   "0000000000000000000000000000000000000000000000000000000000000000",&local_179);
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_158,(string *)local_178);
        cfd::core::BlindFactor::operator=(&params.blind_param.abf,(BlindFactor *)&local_158);
      }
      else {
        std::__cxx11::string::string((string *)local_178,asset_blind_factor,&local_179);
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_158,(string *)local_178);
        cfd::core::BlindFactor::operator=(&params.blind_param.abf,(BlindFactor *)&local_158);
      }
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_158);
      std::__cxx11::string::~string((string *)local_178);
      bVar1 = cfd::capi::IsEmptyString(value_blind_factor);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)local_178,
                   "0000000000000000000000000000000000000000000000000000000000000000",&local_179);
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_158,(string *)local_178);
        cfd::core::BlindFactor::operator=(&params.blind_param.vbf,(BlindFactor *)&local_158);
      }
      else {
        std::__cxx11::string::string((string *)local_178,value_blind_factor,&local_179);
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_158,(string *)local_178);
        cfd::core::BlindFactor::operator=(&params.blind_param.vbf,(BlindFactor *)&local_158);
      }
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_158);
      std::__cxx11::string::~string((string *)local_178);
      params.is_issuance = false;
      bVar1 = cfd::capi::IsEmptyString(asset_key);
      if (!bVar1) {
        params.is_issuance = true;
        std::__cxx11::string::string((string *)local_178,asset_key,&local_179);
        cfd::core::Privkey::Privkey((Privkey *)&local_158,(string *)local_178,kMainnet,true);
        cfd::core::Privkey::operator=(&params.issuance_key.asset_key,(Privkey *)&local_158);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
        std::__cxx11::string::~string((string *)local_178);
      }
      bVar1 = cfd::capi::IsEmptyString(token_key);
      if (!bVar1) {
        params.is_issuance = true;
        std::__cxx11::string::string((string *)local_178,token_key,&local_179);
        cfd::core::Privkey::Privkey((Privkey *)&local_158,(string *)local_178,kMainnet,true);
        cfd::core::Privkey::operator=(&params.issuance_key.token_key,(Privkey *)&local_158);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
        std::__cxx11::string::~string((string *)local_178);
      }
      std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>::
      push_back(*(vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                  **)((long)blind_handle + 0x10),&params);
      cfd::api::TxInBlindParameters::~TxInBlindParameters(&params);
      return 0;
    }
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x4a8;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddBlindTxInData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"asset is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. asset is null or empty.",
               (allocator *)&local_158);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&params);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  params.txid._vptr_Txid = (_func_int **)0x4fbb12;
  params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x4a2;
  params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdAddBlindTxInData";
  cfd::core::logger::warn<>((CfdSourceLocation *)&params,"txid is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&params,"Failed to parameter. txid is null or empty.",(allocator *)&local_158
            );
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&params);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddBlindTxInData(
    void* handle, void* blind_handle, const char* txid, uint32_t vout,
    const char* asset_string, const char* asset_blind_factor,
    const char* value_blind_factor, int64_t value_satoshi,
    const char* asset_key, const char* token_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txin_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    TxInBlindParameters params;
    params.txid = Txid(txid);
    params.vout = vout;
    params.blind_param.asset = ConfidentialAssetId(asset_string);
    params.blind_param.value =
        ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    if (IsEmptyString(asset_blind_factor)) {
      params.blind_param.abf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.abf = BlindFactor(asset_blind_factor);
    }
    if (IsEmptyString(value_blind_factor)) {
      params.blind_param.vbf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.vbf = BlindFactor(value_blind_factor);
    }

    params.is_issuance = false;
    if (!IsEmptyString(asset_key)) {
      params.is_issuance = true;
      params.issuance_key.asset_key = Privkey(asset_key);
    }
    if (!IsEmptyString(token_key)) {
      params.is_issuance = true;
      params.issuance_key.token_key = Privkey(token_key);
    }

    buffer->txin_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}